

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.h
# Opt level: O0

shared_ptr<ut::setup_impl<agge::tests::PODVectorTests>,_unsigned_int> __thiscall
ut::registry::get_setup<agge::tests::PODVectorTests>(registry *this)

{
  bool bVar1;
  setup_impl<agge::tests::PODVectorTests> *this_00;
  pointer ppVar2;
  uint *extraout_RDX;
  long in_RSI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>,_bool>
  pVar3;
  shared_ptr<ut::setup_impl<agge::tests::PODVectorTests>,_unsigned_int> sVar4;
  shared_ptr<ut::destructible,_unsigned_int> local_118;
  byte local_101;
  string local_100 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>
  local_e0;
  value_type local_b0;
  iterator local_80;
  undefined1 local_78;
  iterator local_70;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>
  local_68;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>
  local_60 [3];
  iterator local_48;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>
  local_40;
  const_iterator s;
  string id;
  registry *this_local;
  
  agge::tests::PODVectorTests::__suite_id_abi_cxx11_();
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>_>
               *)(in_RSI + 0x48),(key_type *)&s);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>
  ::_Rb_tree_const_iterator(&local_40,&local_48);
  local_101 = 0;
  local_70._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>_>
              *)(in_RSI + 0x48));
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>
  ::_Rb_tree_const_iterator(&local_68,&local_70);
  bVar1 = std::operator==(&local_40,&local_68);
  if (bVar1) {
    std::__cxx11::string::string(local_100,(string *)&s);
    local_101 = 1;
    this_00 = (setup_impl<agge::tests::PODVectorTests> *)operator_new(0x38);
    setup_impl<agge::tests::PODVectorTests>::setup_impl(this_00);
    shared_ptr<ut::destructible,_unsigned_int>::shared_ptr(&local_118,(destructible *)this_00);
    std::make_pair<std::__cxx11::string,ut::shared_ptr<ut::destructible,unsigned_int>>
              (&local_e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
               &local_118);
    std::pair<std::__cxx11::string_const,ut::shared_ptr<ut::destructible,unsigned_int>>::
    pair<std::__cxx11::string,ut::shared_ptr<ut::destructible,unsigned_int>>
              ((pair<std::__cxx11::string_const,ut::shared_ptr<ut::destructible,unsigned_int>> *)
               &local_b0,&local_e0);
    pVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>_>
            ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>_>
                      *)(in_RSI + 0x48),&local_b0);
    local_80._M_node = (_Base_ptr)pVar3.first._M_node;
    local_78 = pVar3.second;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>
    ::_Rb_tree_const_iterator(local_60,&local_80);
  }
  else {
    local_60[0]._M_node = local_40._M_node;
  }
  local_40._M_node = local_60[0]._M_node;
  if (bVar1) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>
    ::~pair(&local_b0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>
    ::~pair(&local_e0);
    shared_ptr<ut::destructible,_unsigned_int>::~shared_ptr(&local_118);
  }
  if ((local_101 & 1) != 0) {
    std::__cxx11::string::~string(local_100);
  }
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>
           ::operator->(&local_40);
  static_pointer_cast<ut::setup_impl<agge::tests::PODVectorTests>,ut::destructible,unsigned_int>
            ((ut *)this,&ppVar2->second);
  std::__cxx11::string::~string((string *)&s);
  sVar4._refcount = extraout_RDX;
  sVar4._ptr = (setup_impl<agge::tests::PODVectorTests> *)this;
  return sVar4;
}

Assistant:

inline shared_ptr< setup_impl< FixtureT > > registry::get_setup()
	{
		typedef setup_impl<FixtureT> fixture_setup;

		const std::string id = FixtureT::__suite_id();
		_setups_map_t::const_iterator s = _setups.find(id);

		s = s == _setups.end() ?
			_setups.insert(std::make_pair(id, shared_ptr<destructible>(new fixture_setup))).first : s;
		return shared_ptr<fixture_setup>(static_pointer_cast< fixture_setup >(s->second));
	}